

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvip_string.c
# Opt level: O0

PVIPString * PVIP_string_new(void)

{
  PVIPString *__s;
  char *pcVar1;
  PVIPString *str;
  
  __s = (PVIPString *)malloc(0x18);
  if (__s == (PVIPString *)0x0) {
    fprintf(_stderr,"[PVIP] Cannot allocate memory\n");
    abort();
  }
  memset(__s,0,0x18);
  __s->len = 0;
  __s->buflen = 0x100;
  pcVar1 = (char *)malloc(__s->buflen);
  __s->buf = pcVar1;
  if (__s->buf == (char *)0x0) {
    fprintf(_stderr,"[PVIP] Cannot allocate memory\n");
    abort();
  }
  return __s;
}

Assistant:

PVIPString *PVIP_string_new() {
    PVIPString *str = malloc(sizeof(PVIPString));
    if (!str) {
        fprintf(stderr, "[PVIP] Cannot allocate memory\n");
        abort();
    }
    memset(str, 0, sizeof(PVIPString));
    str->len    = 0;
    str->buflen = 256;
    str->buf    = malloc(str->buflen);
    if (!str->buf) {
        fprintf(stderr, "[PVIP] Cannot allocate memory\n");
        abort();
    }
    return str;
}